

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

_Bool array_bitset_container_xor
                (array_container_t *src_1,bitset_container_t *src_2,container_t **dst)

{
  bitset_container_t *bits;
  uint64_t uVar1;
  array_container_t *paVar2;
  int iVar3;
  
  bits = bitset_container_create();
  bits->cardinality = src_2->cardinality;
  memcpy(bits->words,src_2->words,0x2000);
  uVar1 = bitset_flip_list_withcard
                    (bits->words,(long)bits->cardinality,src_1->array,(long)src_1->cardinality);
  iVar3 = (int)uVar1;
  bits->cardinality = iVar3;
  if (iVar3 < 0x1001) {
    paVar2 = array_container_from_bitset(bits);
    *dst = paVar2;
    bitset_container_free(bits);
  }
  else {
    *dst = bits;
  }
  return 0x1000 < iVar3;
}

Assistant:

bool array_bitset_container_xor(const array_container_t *src_1,
                                const bitset_container_t *src_2,
                                container_t **dst) {
    bitset_container_t *result = bitset_container_create();
    bitset_container_copy(src_2, result);
    result->cardinality = (int32_t)bitset_flip_list_withcard(
        result->words, result->cardinality, src_1->array, src_1->cardinality);

    // do required type conversions.
    if (result->cardinality <= DEFAULT_MAX_SIZE) {
        *dst = array_container_from_bitset(result);
        bitset_container_free(result);
        return false;  // not bitset
    }
    *dst = result;
    return true;  // bitset
}